

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

void P_BringUpWeapon(player_t *player)

{
  TObjPtr<AWeapon> *obj;
  double dVar1;
  int iVar2;
  APlayerPawn *ent;
  AWeapon *pAVar3;
  AInventory *pAVar4;
  AWeapon *this;
  DPSprite *pDVar5;
  FState *pFVar6;
  FSoundID local_2c;
  
  this = player->PendingWeapon;
  if (this == (AWeapon *)AWeapon::RegistrationInfo.MyClass) {
    if (player->ReadyWeapon != (AWeapon *)0x0) {
      pDVar5 = player_t::GetPSprite(player,PSP_WEAPON);
      pDVar5->y = 32.0;
      pFVar6 = AWeapon::GetReadyState(player->ReadyWeapon);
      P_SetPsprite(player,PSP_WEAPON,pFVar6,false);
      return;
    }
  }
  else {
    if (this == (AWeapon *)0x0) {
      this = (AWeapon *)0x0;
    }
    else {
      obj = &this->SisterWeapon;
      pAVar3 = GC::ReadBarrier<AWeapon>((AWeapon **)obj);
      if (pAVar3 != (AWeapon *)0x0) {
        pAVar3 = GC::ReadBarrier<AWeapon>((AWeapon **)obj);
        if (((pAVar3->super_AStateProvider).super_AInventory.field_0x4fd & 4) != 0) {
          pAVar4 = AActor::FindInventory
                             (&player->mo->super_AActor,
                              (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass,true);
          if (pAVar4 != (AInventory *)0x0) {
            this = GC::ReadBarrier<AWeapon>((AWeapon **)obj);
          }
        }
      }
    }
    player->PendingWeapon = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
    player->ReadyWeapon = this;
    ent = player->mo;
    (ent->super_AActor).weaponspecial = 0;
    if (this != (AWeapon *)0x0) {
      iVar2 = (this->UpSound).super_FSoundID.ID;
      if (iVar2 != 0) {
        local_2c.ID = iVar2;
        S_Sound(&ent->super_AActor,1,&local_2c,1.0,1.0);
      }
      player->refire = 0;
      dVar1 = *(double *)(&DAT_005d5ad0 + (ulong)(((uint)player->cheats >> 0xb & 1) == 0) * 8);
      pDVar5 = player_t::GetPSprite(player,PSP_WEAPON);
      pDVar5->y = dVar1;
      P_SetPsprite(player,PSP_FLASH,(FState *)0x0,false);
      pFVar6 = AWeapon::GetUpState(this);
      P_SetPsprite(player,PSP_WEAPON,pFVar6,false);
    }
  }
  return;
}

Assistant:

void P_BringUpWeapon (player_t *player)
{
	AWeapon *weapon;

	if (player->PendingWeapon == WP_NOCHANGE)
	{
		if (player->ReadyWeapon != nullptr)
		{
			player->GetPSprite(PSP_WEAPON)->y = WEAPONTOP;
			P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->GetReadyState());
		}
		return;
	}

	weapon = player->PendingWeapon;

	// If the player has a tome of power, use this weapon's powered up
	// version, if one is available.
	if (weapon != nullptr &&
		weapon->SisterWeapon &&
		weapon->SisterWeapon->WeaponFlags & WIF_POWERED_UP &&
		player->mo->FindInventory (RUNTIME_CLASS(APowerWeaponLevel2), true))
	{
		weapon = weapon->SisterWeapon;
	}

	player->PendingWeapon = WP_NOCHANGE;
	player->ReadyWeapon = weapon;
	player->mo->weaponspecial = 0;

	if (weapon != nullptr)
	{
		if (weapon->UpSound)
		{
			S_Sound (player->mo, CHAN_WEAPON, weapon->UpSound, 1, ATTN_NORM);
		}
		player->refire = 0;

		player->GetPSprite(PSP_WEAPON)->y = player->cheats & CF_INSTANTWEAPSWITCH
			? WEAPONTOP : WEAPONBOTTOM;
		// make sure that the previous weapon's flash state is terminated.
		// When coming here from a weapon drop it may still be active.
		P_SetPsprite(player, PSP_FLASH, nullptr);
		P_SetPsprite(player, PSP_WEAPON, weapon->GetUpState());
	}
}